

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# blake2b-ref.c
# Opt level: O1

void blake2b_compress(blake2b_state *S,uint8_t *block)

{
  uint64_t *puVar1;
  uint64_t *puVar2;
  uint uVar3;
  uint uVar4;
  uint uVar5;
  uint uVar6;
  uint uVar7;
  uint uVar8;
  uint uVar9;
  uint uVar10;
  uint64_t uVar11;
  long lVar12;
  ulong uVar13;
  ulong uVar14;
  ulong uVar15;
  ulong uVar16;
  undefined1 *puVar17;
  ulong uVar18;
  ulong uVar19;
  undefined1 *puVar20;
  ulong uVar21;
  undefined1 *puVar22;
  undefined1 *puVar23;
  undefined1 *puVar24;
  ulong uVar25;
  ulong uVar26;
  ulong uVar27;
  long in_FS_OFFSET;
  uint64_t v [16];
  uint64_t m [16];
  undefined8 local_138;
  undefined8 uStack_130;
  undefined1 *local_128;
  undefined1 *puStack_120;
  ulong local_118;
  ulong uStack_110;
  ulong local_108;
  ulong uStack_100;
  undefined8 local_f8;
  undefined8 uStack_f0;
  ulong local_e8;
  ulong uStack_e0;
  ulong local_d8;
  ulong uStack_d0;
  ulong local_c8;
  ulong uStack_c0;
  undefined1 *local_b8 [16];
  long local_38;
  
  local_38 = *(long *)(in_FS_OFFSET + 0x28);
  local_b8[0xe] = &DAT_aaaaaaaaaaaaaaaa;
  local_b8[0xf] = &DAT_aaaaaaaaaaaaaaaa;
  local_b8[0xc] = &DAT_aaaaaaaaaaaaaaaa;
  local_b8[0xd] = &DAT_aaaaaaaaaaaaaaaa;
  local_b8[10] = &DAT_aaaaaaaaaaaaaaaa;
  local_b8[0xb] = &DAT_aaaaaaaaaaaaaaaa;
  local_b8[8] = &DAT_aaaaaaaaaaaaaaaa;
  local_b8[9] = &DAT_aaaaaaaaaaaaaaaa;
  local_b8[6] = &DAT_aaaaaaaaaaaaaaaa;
  local_b8[7] = &DAT_aaaaaaaaaaaaaaaa;
  local_b8[4] = &DAT_aaaaaaaaaaaaaaaa;
  local_b8[5] = &DAT_aaaaaaaaaaaaaaaa;
  local_b8[2] = &DAT_aaaaaaaaaaaaaaaa;
  local_b8[3] = &DAT_aaaaaaaaaaaaaaaa;
  local_b8[0] = &DAT_aaaaaaaaaaaaaaaa;
  local_b8[1] = &DAT_aaaaaaaaaaaaaaaa;
  lVar12 = 0;
  do {
    local_b8[lVar12] = *(undefined1 **)(block + lVar12 * 8);
    lVar12 = lVar12 + 1;
  } while (lVar12 != 0x10);
  uVar14 = S->t[0] ^ 0x510e527fade682d1 ^ (ulong)(local_b8[0] + S->h[0] + S->h[4]);
  uVar15 = uVar14 << 0x20 | uVar14 >> 0x20;
  local_f8 = uVar15 + 0x6a09e667f3bcc908;
  uVar14 = S->h[4] ^ local_f8;
  uVar14 = uVar14 << 0x28 | uVar14 >> 0x18;
  puVar17 = local_b8[0] + S->h[0] + S->h[4] + (long)local_b8[1] + uVar14;
  uVar15 = uVar15 ^ (ulong)puVar17;
  uVar16 = uVar15 << 0x30 | uVar15 >> 0x10;
  local_f8 = local_f8 + uVar16;
  uVar14 = uVar14 ^ local_f8;
  uVar13 = uVar14 << 1 | (ulong)((long)uVar14 < 0);
  uVar14 = S->t[1] ^ 0x9b05688c2b3e6c1f ^ (ulong)(local_b8[2] + S->h[1] + S->h[5]);
  uVar15 = uVar14 << 0x20 | uVar14 >> 0x20;
  uStack_f0 = uVar15 + 0xbb67ae8584caa73b;
  uVar14 = S->h[5] ^ uStack_f0;
  uVar14 = uVar14 << 0x28 | uVar14 >> 0x18;
  puVar22 = local_b8[2] + S->h[1] + S->h[5] + (long)local_b8[3] + uVar14;
  uVar15 = uVar15 ^ (ulong)puVar22;
  uVar19 = uVar15 << 0x30 | uVar15 >> 0x10;
  uStack_f0 = uStack_f0 + uVar19;
  uVar14 = uVar14 ^ uStack_f0;
  uVar14 = uVar14 << 1 | (ulong)((long)uVar14 < 0);
  uVar15 = S->f[0] ^ 0x1f83d9abfb41bd6b ^ (ulong)(local_b8[4] + S->h[2] + S->h[6]);
  uVar25 = uVar15 << 0x20 | uVar15 >> 0x20;
  local_e8 = uVar25 + 0x3c6ef372fe94f82b;
  uVar15 = S->h[6] ^ local_e8;
  uVar15 = uVar15 << 0x28 | uVar15 >> 0x18;
  puVar20 = local_b8[4] + S->h[2] + S->h[6] + (long)local_b8[5] + uVar15;
  uVar25 = uVar25 ^ (ulong)puVar20;
  uVar26 = uVar25 << 0x30 | uVar25 >> 0x10;
  local_e8 = local_e8 + uVar26;
  uVar15 = uVar15 ^ local_e8;
  uVar18 = uVar15 << 1 | (ulong)((long)uVar15 < 0);
  uVar15 = S->f[1] ^ 0x5be0cd19137e2179 ^ (ulong)(local_b8[6] + S->h[3] + S->h[7]);
  uVar25 = uVar15 << 0x20 | uVar15 >> 0x20;
  uStack_e0 = uVar25 + 0xa54ff53a5f1d36f1;
  uVar15 = S->h[7] ^ uStack_e0;
  uVar15 = uVar15 << 0x28 | uVar15 >> 0x18;
  puVar23 = local_b8[6] + S->h[3] + S->h[7] + (long)local_b8[7] + uVar15;
  uVar25 = uVar25 ^ (ulong)puVar23;
  uVar21 = uVar25 << 0x30 | uVar25 >> 0x10;
  uStack_e0 = uStack_e0 + uVar21;
  uVar15 = uVar15 ^ uStack_e0;
  uVar25 = uVar15 << 1 | (ulong)((long)uVar15 < 0);
  puVar17 = puVar17 + (long)local_b8[8] + uVar14;
  uVar21 = uVar21 ^ (ulong)puVar17;
  uVar15 = uVar21 << 0x20 | uVar21 >> 0x20;
  local_e8 = local_e8 + uVar15;
  uVar14 = uVar14 ^ local_e8;
  uVar14 = uVar14 << 0x28 | uVar14 >> 0x18;
  puVar17 = puVar17 + (long)local_b8[9] + uVar14;
  uVar15 = uVar15 ^ (ulong)puVar17;
  uVar21 = uVar15 << 0x30 | uVar15 >> 0x10;
  local_e8 = local_e8 + uVar21;
  uVar14 = uVar14 ^ local_e8;
  uVar15 = uVar14 << 1 | (ulong)((long)uVar14 < 0);
  puVar22 = puVar22 + (long)local_b8[10] + uVar18;
  uVar16 = uVar16 ^ (ulong)puVar22;
  uVar14 = uVar16 << 0x20 | uVar16 >> 0x20;
  uStack_e0 = uStack_e0 + uVar14;
  uVar18 = uVar18 ^ uStack_e0;
  uVar18 = uVar18 << 0x28 | uVar18 >> 0x18;
  puVar22 = puVar22 + (long)local_b8[0xb] + uVar18;
  uVar14 = uVar14 ^ (ulong)puVar22;
  uVar16 = uVar14 << 0x30 | uVar14 >> 0x10;
  uStack_e0 = uStack_e0 + uVar16;
  uVar18 = uVar18 ^ uStack_e0;
  uVar18 = uVar18 << 1 | (ulong)((long)uVar18 < 0);
  puVar20 = puVar20 + (long)local_b8[0xc] + uVar25;
  uVar19 = uVar19 ^ (ulong)puVar20;
  uVar19 = uVar19 << 0x20 | uVar19 >> 0x20;
  local_f8 = local_f8 + uVar19;
  uVar25 = uVar25 ^ local_f8;
  uVar14 = uVar25 << 0x28 | uVar25 >> 0x18;
  puVar20 = puVar20 + (long)local_b8[0xd] + uVar14;
  uVar19 = uVar19 ^ (ulong)puVar20;
  uVar19 = uVar19 << 0x30 | uVar19 >> 0x10;
  local_f8 = local_f8 + uVar19;
  uVar14 = uVar14 ^ local_f8;
  uVar25 = uVar14 << 1 | (ulong)((long)uVar14 < 0);
  puVar23 = puVar23 + (long)local_b8[0xe] + uVar13;
  uVar26 = uVar26 ^ (ulong)puVar23;
  uVar26 = uVar26 << 0x20 | uVar26 >> 0x20;
  uStack_f0 = uStack_f0 + uVar26;
  uVar13 = uVar13 ^ uStack_f0;
  uVar14 = uVar13 << 0x28 | uVar13 >> 0x18;
  puVar23 = puVar23 + (long)local_b8[0xf] + uVar14;
  uVar26 = uVar26 ^ (ulong)puVar23;
  uVar26 = uVar26 << 0x30 | uVar26 >> 0x10;
  uStack_f0 = uStack_f0 + uVar26;
  uVar14 = uVar14 ^ uStack_f0;
  uVar14 = uVar14 << 1 | (ulong)((long)uVar14 < 0);
  puVar17 = puVar17 + (long)local_b8[0xe] + uVar14;
  uVar16 = uVar16 ^ (ulong)puVar17;
  uVar13 = uVar16 << 0x20 | uVar16 >> 0x20;
  local_f8 = local_f8 + uVar13;
  uVar14 = uVar14 ^ local_f8;
  uVar14 = uVar14 << 0x28 | uVar14 >> 0x18;
  puVar17 = puVar17 + (long)local_b8[10] + uVar14;
  uVar13 = uVar13 ^ (ulong)puVar17;
  uVar13 = uVar13 << 0x30 | uVar13 >> 0x10;
  local_f8 = local_f8 + uVar13;
  uVar14 = uVar14 ^ local_f8;
  uVar14 = uVar14 << 1 | (ulong)((long)uVar14 < 0);
  puVar22 = puVar22 + (long)local_b8[4] + uVar15;
  uVar19 = uVar19 ^ (ulong)puVar22;
  uVar16 = uVar19 << 0x20 | uVar19 >> 0x20;
  uStack_f0 = uStack_f0 + uVar16;
  uVar15 = uVar15 ^ uStack_f0;
  uVar15 = uVar15 << 0x28 | uVar15 >> 0x18;
  puVar22 = puVar22 + (long)local_b8[8] + uVar15;
  uVar16 = uVar16 ^ (ulong)puVar22;
  uVar19 = uVar16 << 0x30 | uVar16 >> 0x10;
  uStack_f0 = uStack_f0 + uVar19;
  uVar15 = uVar15 ^ uStack_f0;
  uVar15 = uVar15 << 1 | (ulong)((long)uVar15 < 0);
  puVar20 = puVar20 + (long)local_b8[9] + uVar18;
  uVar26 = uVar26 ^ (ulong)puVar20;
  uVar26 = uVar26 << 0x20 | uVar26 >> 0x20;
  local_e8 = local_e8 + uVar26;
  uVar18 = uVar18 ^ local_e8;
  uVar16 = uVar18 << 0x28 | uVar18 >> 0x18;
  puVar20 = puVar20 + (long)local_b8[0xf] + uVar16;
  uVar26 = uVar26 ^ (ulong)puVar20;
  uVar26 = uVar26 << 0x30 | uVar26 >> 0x10;
  local_e8 = local_e8 + uVar26;
  uVar16 = uVar16 ^ local_e8;
  uVar18 = uVar16 << 1 | (ulong)((long)uVar16 < 0);
  puVar23 = puVar23 + (long)local_b8[0xd] + uVar25;
  uVar21 = uVar21 ^ (ulong)puVar23;
  uVar21 = uVar21 << 0x20 | uVar21 >> 0x20;
  uStack_e0 = uStack_e0 + uVar21;
  uVar25 = uVar25 ^ uStack_e0;
  uVar16 = uVar25 << 0x28 | uVar25 >> 0x18;
  puVar23 = puVar23 + (long)local_b8[6] + uVar16;
  uVar21 = uVar21 ^ (ulong)puVar23;
  uVar25 = uVar21 << 0x30 | uVar21 >> 0x10;
  uStack_e0 = uStack_e0 + uVar25;
  uVar16 = uVar16 ^ uStack_e0;
  uVar16 = uVar16 << 1 | (ulong)((long)uVar16 < 0);
  puVar17 = puVar17 + (long)local_b8[1] + uVar15;
  uVar25 = uVar25 ^ (ulong)puVar17;
  uVar25 = uVar25 << 0x20 | uVar25 >> 0x20;
  local_e8 = local_e8 + uVar25;
  uVar15 = uVar15 ^ local_e8;
  uVar15 = uVar15 << 0x28 | uVar15 >> 0x18;
  puVar17 = puVar17 + (long)local_b8[0xc] + uVar15;
  uVar25 = uVar25 ^ (ulong)puVar17;
  uVar21 = uVar25 << 0x30 | uVar25 >> 0x10;
  local_e8 = local_e8 + uVar21;
  uVar15 = uVar15 ^ local_e8;
  uVar15 = uVar15 << 1 | (ulong)((long)uVar15 < 0);
  puVar22 = puVar22 + (long)local_b8[0] + uVar18;
  uVar13 = uVar13 ^ (ulong)puVar22;
  uVar13 = uVar13 << 0x20 | uVar13 >> 0x20;
  uStack_e0 = uStack_e0 + uVar13;
  uVar18 = uVar18 ^ uStack_e0;
  uVar25 = uVar18 << 0x28 | uVar18 >> 0x18;
  puVar22 = puVar22 + (long)local_b8[2] + uVar25;
  uVar13 = uVar13 ^ (ulong)puVar22;
  uVar13 = uVar13 << 0x30 | uVar13 >> 0x10;
  uStack_e0 = uStack_e0 + uVar13;
  uVar25 = uVar25 ^ uStack_e0;
  uVar25 = uVar25 << 1 | (ulong)((long)uVar25 < 0);
  puVar20 = puVar20 + (long)local_b8[0xb] + uVar16;
  uVar19 = uVar19 ^ (ulong)puVar20;
  uVar18 = uVar19 << 0x20 | uVar19 >> 0x20;
  local_f8 = local_f8 + uVar18;
  uVar16 = uVar16 ^ local_f8;
  uVar16 = uVar16 << 0x28 | uVar16 >> 0x18;
  puVar20 = puVar20 + (long)local_b8[7] + uVar16;
  uVar18 = uVar18 ^ (ulong)puVar20;
  uVar18 = uVar18 << 0x30 | uVar18 >> 0x10;
  local_f8 = local_f8 + uVar18;
  uVar16 = uVar16 ^ local_f8;
  uVar16 = uVar16 << 1 | (ulong)((long)uVar16 < 0);
  puVar23 = puVar23 + (long)local_b8[5] + uVar14;
  uVar26 = uVar26 ^ (ulong)puVar23;
  uVar19 = uVar26 << 0x20 | uVar26 >> 0x20;
  uStack_f0 = uStack_f0 + uVar19;
  uVar14 = uVar14 ^ uStack_f0;
  uVar14 = uVar14 << 0x28 | uVar14 >> 0x18;
  puVar23 = puVar23 + (long)local_b8[3] + uVar14;
  uVar19 = uVar19 ^ (ulong)puVar23;
  uVar19 = uVar19 << 0x30 | uVar19 >> 0x10;
  uStack_f0 = uStack_f0 + uVar19;
  uVar14 = uVar14 ^ uStack_f0;
  uVar14 = uVar14 << 1 | (ulong)((long)uVar14 < 0);
  puVar17 = puVar17 + (long)local_b8[0xb] + uVar14;
  uVar13 = uVar13 ^ (ulong)puVar17;
  uVar13 = uVar13 << 0x20 | uVar13 >> 0x20;
  local_f8 = local_f8 + uVar13;
  uVar14 = uVar14 ^ local_f8;
  uVar14 = uVar14 << 0x28 | uVar14 >> 0x18;
  puVar17 = puVar17 + (long)local_b8[8] + uVar14;
  uVar13 = uVar13 ^ (ulong)puVar17;
  uVar13 = uVar13 << 0x30 | uVar13 >> 0x10;
  local_f8 = local_f8 + uVar13;
  uVar14 = uVar14 ^ local_f8;
  uVar14 = uVar14 << 1 | (ulong)((long)uVar14 < 0);
  puVar22 = puVar22 + (long)local_b8[0xc] + uVar15;
  uVar18 = uVar18 ^ (ulong)puVar22;
  uVar18 = uVar18 << 0x20 | uVar18 >> 0x20;
  uStack_f0 = uStack_f0 + uVar18;
  uVar15 = uVar15 ^ uStack_f0;
  uVar15 = uVar15 << 0x28 | uVar15 >> 0x18;
  puVar22 = puVar22 + (long)local_b8[0] + uVar15;
  uVar18 = uVar18 ^ (ulong)puVar22;
  uVar18 = uVar18 << 0x30 | uVar18 >> 0x10;
  uStack_f0 = uStack_f0 + uVar18;
  uVar15 = uVar15 ^ uStack_f0;
  uVar15 = uVar15 << 1 | (ulong)((long)uVar15 < 0);
  puVar20 = puVar20 + (long)local_b8[5] + uVar25;
  uVar19 = uVar19 ^ (ulong)puVar20;
  uVar19 = uVar19 << 0x20 | uVar19 >> 0x20;
  local_e8 = local_e8 + uVar19;
  uVar25 = uVar25 ^ local_e8;
  uVar25 = uVar25 << 0x28 | uVar25 >> 0x18;
  puVar20 = puVar20 + (long)local_b8[2] + uVar25;
  uVar19 = uVar19 ^ (ulong)puVar20;
  uVar26 = uVar19 << 0x30 | uVar19 >> 0x10;
  local_e8 = local_e8 + uVar26;
  uVar25 = uVar25 ^ local_e8;
  uVar25 = uVar25 << 1 | (ulong)((long)uVar25 < 0);
  puVar23 = puVar23 + (long)local_b8[0xf] + uVar16;
  uVar21 = uVar21 ^ (ulong)puVar23;
  uVar19 = uVar21 << 0x20 | uVar21 >> 0x20;
  uStack_e0 = uStack_e0 + uVar19;
  uVar16 = uVar16 ^ uStack_e0;
  uVar16 = uVar16 << 0x28 | uVar16 >> 0x18;
  puVar23 = puVar23 + (long)local_b8[0xd] + uVar16;
  uVar19 = uVar19 ^ (ulong)puVar23;
  uVar19 = uVar19 << 0x30 | uVar19 >> 0x10;
  uStack_e0 = uStack_e0 + uVar19;
  uVar16 = uVar16 ^ uStack_e0;
  uVar16 = uVar16 << 1 | (ulong)((long)uVar16 < 0);
  puVar17 = puVar17 + (long)local_b8[10] + uVar15;
  uVar19 = uVar19 ^ (ulong)puVar17;
  uVar19 = uVar19 << 0x20 | uVar19 >> 0x20;
  local_e8 = local_e8 + uVar19;
  uVar15 = uVar15 ^ local_e8;
  uVar15 = uVar15 << 0x28 | uVar15 >> 0x18;
  puVar17 = puVar17 + (long)local_b8[0xe] + uVar15;
  uVar19 = uVar19 ^ (ulong)puVar17;
  uVar19 = uVar19 << 0x30 | uVar19 >> 0x10;
  local_e8 = local_e8 + uVar19;
  uVar15 = uVar15 ^ local_e8;
  uVar15 = uVar15 << 1 | (ulong)((long)uVar15 < 0);
  puVar22 = puVar22 + (long)local_b8[3] + uVar25;
  uVar13 = uVar13 ^ (ulong)puVar22;
  uVar13 = uVar13 << 0x20 | uVar13 >> 0x20;
  uStack_e0 = uStack_e0 + uVar13;
  uVar25 = uVar25 ^ uStack_e0;
  uVar25 = uVar25 << 0x28 | uVar25 >> 0x18;
  puVar22 = puVar22 + (long)local_b8[6] + uVar25;
  uVar13 = uVar13 ^ (ulong)puVar22;
  uVar13 = uVar13 << 0x30 | uVar13 >> 0x10;
  uStack_e0 = uStack_e0 + uVar13;
  uVar25 = uVar25 ^ uStack_e0;
  uVar25 = uVar25 << 1 | (ulong)((long)uVar25 < 0);
  puVar20 = puVar20 + (long)local_b8[7] + uVar16;
  uVar18 = uVar18 ^ (ulong)puVar20;
  uVar18 = uVar18 << 0x20 | uVar18 >> 0x20;
  local_f8 = local_f8 + uVar18;
  uVar16 = uVar16 ^ local_f8;
  uVar16 = uVar16 << 0x28 | uVar16 >> 0x18;
  puVar20 = puVar20 + (long)local_b8[1] + uVar16;
  uVar18 = uVar18 ^ (ulong)puVar20;
  uVar18 = uVar18 << 0x30 | uVar18 >> 0x10;
  local_f8 = local_f8 + uVar18;
  uVar16 = uVar16 ^ local_f8;
  uVar16 = uVar16 << 1 | (ulong)((long)uVar16 < 0);
  puVar23 = puVar23 + (long)local_b8[9] + uVar14;
  uVar26 = uVar26 ^ (ulong)puVar23;
  uVar21 = uVar26 << 0x20 | uVar26 >> 0x20;
  uStack_f0 = uStack_f0 + uVar21;
  uVar14 = uVar14 ^ uStack_f0;
  uVar14 = uVar14 << 0x28 | uVar14 >> 0x18;
  puVar23 = puVar23 + (long)local_b8[4] + uVar14;
  uVar21 = uVar21 ^ (ulong)puVar23;
  uVar21 = uVar21 << 0x30 | uVar21 >> 0x10;
  uStack_f0 = uStack_f0 + uVar21;
  uVar14 = uVar14 ^ uStack_f0;
  uVar14 = uVar14 << 1 | (ulong)((long)uVar14 < 0);
  puVar17 = puVar17 + (long)local_b8[7] + uVar14;
  uVar13 = uVar13 ^ (ulong)puVar17;
  uVar13 = uVar13 << 0x20 | uVar13 >> 0x20;
  local_f8 = local_f8 + uVar13;
  uVar14 = uVar14 ^ local_f8;
  uVar14 = uVar14 << 0x28 | uVar14 >> 0x18;
  puVar17 = puVar17 + (long)local_b8[9] + uVar14;
  uVar13 = uVar13 ^ (ulong)puVar17;
  uVar13 = uVar13 << 0x30 | uVar13 >> 0x10;
  local_f8 = local_f8 + uVar13;
  uVar14 = uVar14 ^ local_f8;
  uVar14 = uVar14 << 1 | (ulong)((long)uVar14 < 0);
  puVar22 = puVar22 + (long)local_b8[3] + uVar15;
  uVar18 = uVar18 ^ (ulong)puVar22;
  uVar18 = uVar18 << 0x20 | uVar18 >> 0x20;
  uStack_f0 = uStack_f0 + uVar18;
  uVar15 = uVar15 ^ uStack_f0;
  uVar15 = uVar15 << 0x28 | uVar15 >> 0x18;
  puVar22 = puVar22 + (long)local_b8[1] + uVar15;
  uVar18 = uVar18 ^ (ulong)puVar22;
  uVar18 = uVar18 << 0x30 | uVar18 >> 0x10;
  uStack_f0 = uStack_f0 + uVar18;
  uVar15 = uVar15 ^ uStack_f0;
  uVar15 = uVar15 << 1 | (ulong)((long)uVar15 < 0);
  puVar20 = puVar20 + (long)local_b8[0xd] + uVar25;
  uVar21 = uVar21 ^ (ulong)puVar20;
  uVar21 = uVar21 << 0x20 | uVar21 >> 0x20;
  local_e8 = local_e8 + uVar21;
  uVar25 = uVar25 ^ local_e8;
  uVar25 = uVar25 << 0x28 | uVar25 >> 0x18;
  puVar20 = puVar20 + (long)local_b8[0xc] + uVar25;
  uVar21 = uVar21 ^ (ulong)puVar20;
  uVar26 = uVar21 << 0x30 | uVar21 >> 0x10;
  local_e8 = local_e8 + uVar26;
  uVar25 = uVar25 ^ local_e8;
  uVar25 = uVar25 << 1 | (ulong)((long)uVar25 < 0);
  puVar23 = puVar23 + (long)local_b8[0xb] + uVar16;
  uVar19 = uVar19 ^ (ulong)puVar23;
  uVar19 = uVar19 << 0x20 | uVar19 >> 0x20;
  uStack_e0 = uStack_e0 + uVar19;
  uVar16 = uVar16 ^ uStack_e0;
  uVar16 = uVar16 << 0x28 | uVar16 >> 0x18;
  puVar23 = puVar23 + (long)local_b8[0xe] + uVar16;
  uVar19 = uVar19 ^ (ulong)puVar23;
  uVar19 = uVar19 << 0x30 | uVar19 >> 0x10;
  uStack_e0 = uStack_e0 + uVar19;
  uVar16 = uVar16 ^ uStack_e0;
  uVar16 = uVar16 << 1 | (ulong)((long)uVar16 < 0);
  puVar17 = puVar17 + (long)local_b8[2] + uVar15;
  uVar19 = uVar19 ^ (ulong)puVar17;
  uVar19 = uVar19 << 0x20 | uVar19 >> 0x20;
  local_e8 = local_e8 + uVar19;
  uVar15 = uVar15 ^ local_e8;
  uVar15 = uVar15 << 0x28 | uVar15 >> 0x18;
  puVar17 = puVar17 + (long)local_b8[6] + uVar15;
  uVar19 = uVar19 ^ (ulong)puVar17;
  uVar21 = uVar19 << 0x30 | uVar19 >> 0x10;
  local_e8 = local_e8 + uVar21;
  uVar15 = uVar15 ^ local_e8;
  uVar15 = uVar15 << 1 | (ulong)((long)uVar15 < 0);
  puVar22 = puVar22 + (long)local_b8[5] + uVar25;
  uVar13 = uVar13 ^ (ulong)puVar22;
  uVar13 = uVar13 << 0x20 | uVar13 >> 0x20;
  uStack_e0 = uStack_e0 + uVar13;
  uVar25 = uVar25 ^ uStack_e0;
  uVar25 = uVar25 << 0x28 | uVar25 >> 0x18;
  puVar22 = puVar22 + (long)local_b8[10] + uVar25;
  uVar13 = uVar13 ^ (ulong)puVar22;
  uVar13 = uVar13 << 0x30 | uVar13 >> 0x10;
  uStack_e0 = uStack_e0 + uVar13;
  uVar25 = uVar25 ^ uStack_e0;
  uVar25 = uVar25 << 1 | (ulong)((long)uVar25 < 0);
  puVar20 = puVar20 + (long)local_b8[4] + uVar16;
  uVar18 = uVar18 ^ (ulong)puVar20;
  uVar18 = uVar18 << 0x20 | uVar18 >> 0x20;
  local_f8 = local_f8 + uVar18;
  uVar16 = uVar16 ^ local_f8;
  uVar16 = uVar16 << 0x28 | uVar16 >> 0x18;
  puVar20 = puVar20 + (long)local_b8[0] + uVar16;
  uVar18 = uVar18 ^ (ulong)puVar20;
  uVar19 = uVar18 << 0x30 | uVar18 >> 0x10;
  local_f8 = local_f8 + uVar19;
  uVar16 = uVar16 ^ local_f8;
  uVar16 = uVar16 << 1 | (ulong)((long)uVar16 < 0);
  puVar23 = puVar23 + (long)local_b8[0xf] + uVar14;
  uVar26 = uVar26 ^ (ulong)puVar23;
  uVar18 = uVar26 << 0x20 | uVar26 >> 0x20;
  uStack_f0 = uStack_f0 + uVar18;
  uVar14 = uVar14 ^ uStack_f0;
  uVar14 = uVar14 << 0x28 | uVar14 >> 0x18;
  puVar23 = puVar23 + (long)local_b8[8] + uVar14;
  uVar18 = uVar18 ^ (ulong)puVar23;
  uVar26 = uVar18 << 0x30 | uVar18 >> 0x10;
  uStack_f0 = uStack_f0 + uVar26;
  uVar14 = uVar14 ^ uStack_f0;
  uVar18 = uVar14 << 1 | (ulong)((long)uVar14 < 0);
  puVar17 = puVar17 + (long)local_b8[9] + uVar18;
  uVar13 = uVar13 ^ (ulong)puVar17;
  uVar14 = uVar13 << 0x20 | uVar13 >> 0x20;
  local_f8 = local_f8 + uVar14;
  uVar18 = uVar18 ^ local_f8;
  uVar18 = uVar18 << 0x28 | uVar18 >> 0x18;
  puVar17 = puVar17 + (long)local_b8[0] + uVar18;
  uVar14 = uVar14 ^ (ulong)puVar17;
  uVar13 = uVar14 << 0x30 | uVar14 >> 0x10;
  local_f8 = local_f8 + uVar13;
  uVar18 = uVar18 ^ local_f8;
  uVar14 = uVar18 << 1 | (ulong)((long)uVar18 < 0);
  puVar22 = puVar22 + (long)local_b8[5] + uVar15;
  uVar19 = uVar19 ^ (ulong)puVar22;
  uVar18 = uVar19 << 0x20 | uVar19 >> 0x20;
  uStack_f0 = uStack_f0 + uVar18;
  uVar15 = uVar15 ^ uStack_f0;
  uVar15 = uVar15 << 0x28 | uVar15 >> 0x18;
  puVar22 = puVar22 + (long)local_b8[7] + uVar15;
  uVar18 = uVar18 ^ (ulong)puVar22;
  uVar18 = uVar18 << 0x30 | uVar18 >> 0x10;
  uStack_f0 = uStack_f0 + uVar18;
  uVar15 = uVar15 ^ uStack_f0;
  uVar15 = uVar15 << 1 | (ulong)((long)uVar15 < 0);
  puVar20 = puVar20 + (long)local_b8[2] + uVar25;
  uVar26 = uVar26 ^ (ulong)puVar20;
  uVar19 = uVar26 << 0x20 | uVar26 >> 0x20;
  local_e8 = local_e8 + uVar19;
  uVar25 = uVar25 ^ local_e8;
  uVar25 = uVar25 << 0x28 | uVar25 >> 0x18;
  puVar20 = puVar20 + (long)local_b8[4] + uVar25;
  uVar19 = uVar19 ^ (ulong)puVar20;
  uVar26 = uVar19 << 0x30 | uVar19 >> 0x10;
  local_e8 = local_e8 + uVar26;
  uVar25 = uVar25 ^ local_e8;
  uVar25 = uVar25 << 1 | (ulong)((long)uVar25 < 0);
  puVar23 = puVar23 + (long)local_b8[10] + uVar16;
  uVar21 = uVar21 ^ (ulong)puVar23;
  uVar19 = uVar21 << 0x20 | uVar21 >> 0x20;
  uStack_e0 = uStack_e0 + uVar19;
  uVar16 = uVar16 ^ uStack_e0;
  uVar16 = uVar16 << 0x28 | uVar16 >> 0x18;
  puVar23 = puVar23 + (long)local_b8[0xf] + uVar16;
  uVar19 = uVar19 ^ (ulong)puVar23;
  uVar19 = uVar19 << 0x30 | uVar19 >> 0x10;
  uStack_e0 = uStack_e0 + uVar19;
  uVar16 = uVar16 ^ uStack_e0;
  uVar16 = uVar16 << 1 | (ulong)((long)uVar16 < 0);
  puVar17 = puVar17 + (long)local_b8[0xe] + uVar15;
  uVar19 = uVar19 ^ (ulong)puVar17;
  uVar19 = uVar19 << 0x20 | uVar19 >> 0x20;
  local_e8 = local_e8 + uVar19;
  uVar15 = uVar15 ^ local_e8;
  uVar15 = uVar15 << 0x28 | uVar15 >> 0x18;
  puVar17 = puVar17 + (long)local_b8[1] + uVar15;
  uVar19 = uVar19 ^ (ulong)puVar17;
  uVar21 = uVar19 << 0x30 | uVar19 >> 0x10;
  local_e8 = local_e8 + uVar21;
  uVar15 = uVar15 ^ local_e8;
  uVar15 = uVar15 << 1 | (ulong)((long)uVar15 < 0);
  puVar22 = puVar22 + (long)local_b8[0xb] + uVar25;
  uVar13 = uVar13 ^ (ulong)puVar22;
  uVar13 = uVar13 << 0x20 | uVar13 >> 0x20;
  uStack_e0 = uStack_e0 + uVar13;
  uVar25 = uVar25 ^ uStack_e0;
  uVar25 = uVar25 << 0x28 | uVar25 >> 0x18;
  puVar22 = puVar22 + (long)local_b8[0xc] + uVar25;
  uVar13 = uVar13 ^ (ulong)puVar22;
  uVar13 = uVar13 << 0x30 | uVar13 >> 0x10;
  uStack_e0 = uStack_e0 + uVar13;
  uVar25 = uVar25 ^ uStack_e0;
  uVar25 = uVar25 << 1 | (ulong)((long)uVar25 < 0);
  puVar20 = puVar20 + (long)local_b8[6] + uVar16;
  uVar18 = uVar18 ^ (ulong)puVar20;
  uVar18 = uVar18 << 0x20 | uVar18 >> 0x20;
  local_f8 = local_f8 + uVar18;
  uVar16 = uVar16 ^ local_f8;
  uVar16 = uVar16 << 0x28 | uVar16 >> 0x18;
  puVar20 = puVar20 + (long)local_b8[8] + uVar16;
  uVar18 = uVar18 ^ (ulong)puVar20;
  uVar18 = uVar18 << 0x30 | uVar18 >> 0x10;
  local_f8 = local_f8 + uVar18;
  uVar16 = uVar16 ^ local_f8;
  uVar16 = uVar16 << 1 | (ulong)((long)uVar16 < 0);
  puVar23 = puVar23 + (long)local_b8[3] + uVar14;
  uVar26 = uVar26 ^ (ulong)puVar23;
  uVar19 = uVar26 << 0x20 | uVar26 >> 0x20;
  uStack_f0 = uStack_f0 + uVar19;
  uVar14 = uVar14 ^ uStack_f0;
  uVar14 = uVar14 << 0x28 | uVar14 >> 0x18;
  puVar23 = puVar23 + (long)local_b8[0xd] + uVar14;
  uVar19 = uVar19 ^ (ulong)puVar23;
  uVar26 = uVar19 << 0x30 | uVar19 >> 0x10;
  uStack_f0 = uStack_f0 + uVar26;
  uVar14 = uVar14 ^ uStack_f0;
  uVar14 = uVar14 << 1 | (ulong)((long)uVar14 < 0);
  puVar17 = puVar17 + (long)local_b8[2] + uVar14;
  uVar13 = uVar13 ^ (ulong)puVar17;
  uVar13 = uVar13 << 0x20 | uVar13 >> 0x20;
  local_f8 = local_f8 + uVar13;
  uVar14 = uVar14 ^ local_f8;
  uVar14 = uVar14 << 0x28 | uVar14 >> 0x18;
  puVar17 = puVar17 + (long)local_b8[0xc] + uVar14;
  uVar13 = uVar13 ^ (ulong)puVar17;
  uVar13 = uVar13 << 0x30 | uVar13 >> 0x10;
  local_f8 = local_f8 + uVar13;
  uVar14 = uVar14 ^ local_f8;
  uVar14 = uVar14 << 1 | (ulong)((long)uVar14 < 0);
  puVar22 = puVar22 + (long)local_b8[6] + uVar15;
  uVar18 = uVar18 ^ (ulong)puVar22;
  uVar18 = uVar18 << 0x20 | uVar18 >> 0x20;
  uStack_f0 = uStack_f0 + uVar18;
  uVar15 = uVar15 ^ uStack_f0;
  uVar15 = uVar15 << 0x28 | uVar15 >> 0x18;
  puVar22 = puVar22 + (long)local_b8[10] + uVar15;
  uVar18 = uVar18 ^ (ulong)puVar22;
  uVar19 = uVar18 << 0x30 | uVar18 >> 0x10;
  uStack_f0 = uStack_f0 + uVar19;
  uVar15 = uVar15 ^ uStack_f0;
  uVar15 = uVar15 << 1 | (ulong)((long)uVar15 < 0);
  puVar20 = puVar20 + (long)local_b8[0] + uVar25;
  uVar26 = uVar26 ^ (ulong)puVar20;
  uVar18 = uVar26 << 0x20 | uVar26 >> 0x20;
  local_e8 = local_e8 + uVar18;
  uVar25 = uVar25 ^ local_e8;
  uVar25 = uVar25 << 0x28 | uVar25 >> 0x18;
  puVar20 = puVar20 + uVar25 + (long)local_b8[0xb];
  uVar18 = uVar18 ^ (ulong)puVar20;
  uVar27 = uVar18 << 0x30 | uVar18 >> 0x10;
  local_e8 = local_e8 + uVar27;
  uVar25 = uVar25 ^ local_e8;
  uVar18 = uVar25 << 1 | (ulong)((long)uVar25 < 0);
  puVar23 = puVar23 + (long)local_b8[8] + uVar16;
  uVar21 = uVar21 ^ (ulong)puVar23;
  uVar25 = uVar21 << 0x20 | uVar21 >> 0x20;
  uStack_e0 = uStack_e0 + uVar25;
  uVar16 = uVar16 ^ uStack_e0;
  uVar16 = uVar16 << 0x28 | uVar16 >> 0x18;
  puVar23 = puVar23 + (long)local_b8[3] + uVar16;
  uVar25 = uVar25 ^ (ulong)puVar23;
  uVar25 = uVar25 << 0x30 | uVar25 >> 0x10;
  uStack_e0 = uStack_e0 + uVar25;
  uVar16 = uVar16 ^ uStack_e0;
  uVar16 = uVar16 << 1 | (ulong)((long)uVar16 < 0);
  puVar17 = puVar17 + uVar15 + (long)local_b8[4];
  uVar25 = uVar25 ^ (ulong)puVar17;
  uVar25 = uVar25 << 0x20 | uVar25 >> 0x20;
  local_e8 = local_e8 + uVar25;
  uVar15 = uVar15 ^ local_e8;
  uVar15 = uVar15 << 0x28 | uVar15 >> 0x18;
  puVar17 = puVar17 + (long)local_b8[0xd] + uVar15;
  uVar25 = uVar25 ^ (ulong)puVar17;
  uVar25 = uVar25 << 0x30 | uVar25 >> 0x10;
  local_e8 = uVar25 + local_e8;
  uVar15 = local_e8 ^ uVar15;
  uVar21 = uVar15 << 1 | (ulong)((long)uVar15 < 0);
  puVar22 = puVar22 + uVar18 + (long)local_b8[7];
  uVar13 = uVar13 ^ (ulong)puVar22;
  uVar15 = uVar13 << 0x20 | uVar13 >> 0x20;
  uStack_e0 = uStack_e0 + uVar15;
  uVar18 = uVar18 ^ uStack_e0;
  uVar13 = uVar18 << 0x28 | uVar18 >> 0x18;
  puVar22 = puVar22 + (long)local_b8[5] + uVar13;
  uVar15 = (ulong)puVar22 ^ uVar15;
  uVar15 = uVar15 << 0x30 | uVar15 >> 0x10;
  uStack_e0 = uVar15 + uStack_e0;
  uVar13 = uStack_e0 ^ uVar13;
  uVar26 = uVar13 << 1 | (ulong)((long)uVar13 < 0);
  puVar20 = puVar20 + uVar16 + (long)local_b8[0xf];
  uVar19 = uVar19 ^ (ulong)puVar20;
  uVar13 = uVar19 << 0x20 | uVar19 >> 0x20;
  local_f8 = local_f8 + uVar13;
  uVar16 = uVar16 ^ local_f8;
  uVar16 = uVar16 << 0x28 | uVar16 >> 0x18;
  puVar20 = puVar20 + (long)local_b8[0xe] + uVar16;
  uVar13 = (ulong)puVar20 ^ uVar13;
  uVar13 = uVar13 << 0x30 | uVar13 >> 0x10;
  local_f8 = uVar13 + local_f8;
  uVar16 = uVar16 ^ local_f8;
  uVar19 = uVar16 << 1 | (ulong)((long)uVar16 < 0);
  puVar23 = puVar23 + (long)local_b8[1] + uVar14;
  uVar27 = uVar27 ^ (ulong)puVar23;
  uVar16 = uVar27 << 0x20 | uVar27 >> 0x20;
  uStack_f0 = uStack_f0 + uVar16;
  uVar14 = uVar14 ^ uStack_f0;
  uVar14 = uVar14 << 0x28 | uVar14 >> 0x18;
  puVar24 = puVar23 + uVar14 + (long)local_b8[9];
  uVar16 = (ulong)puVar24 ^ uVar16;
  uVar16 = uVar16 << 0x30 | uVar16 >> 0x10;
  uStack_f0 = uVar16 + uStack_f0;
  uVar14 = uStack_f0 ^ uVar14;
  uVar18 = uVar14 << 1 | (ulong)((long)uVar14 < 0);
  puVar17 = puVar17 + (long)local_b8[0xc] + uVar18;
  uVar15 = uVar15 ^ (ulong)puVar17;
  uVar14 = uVar15 << 0x20 | uVar15 >> 0x20;
  local_f8 = local_f8 + uVar14;
  uVar18 = uVar18 ^ local_f8;
  uVar15 = uVar18 << 0x28 | uVar18 >> 0x18;
  puVar23 = puVar17 + uVar15 + (long)local_b8[5];
  uVar14 = (ulong)puVar23 ^ uVar14;
  uVar18 = uVar14 << 0x30 | uVar14 >> 0x10;
  local_f8 = uVar18 + local_f8;
  uVar15 = local_f8 ^ uVar15;
  uVar27 = uVar15 << 1 | (ulong)((long)uVar15 < 0);
  puVar17 = puVar22 + uVar21 + (long)local_b8[1];
  uVar13 = uVar13 ^ (ulong)puVar17;
  uVar14 = uVar13 << 0x20 | uVar13 >> 0x20;
  uStack_f0 = uStack_f0 + uVar14;
  uVar21 = uVar21 ^ uStack_f0;
  uVar15 = uVar21 << 0x28 | uVar21 >> 0x18;
  puVar17 = puVar17 + uVar15 + (long)local_b8[0xf];
  uVar14 = (ulong)puVar17 ^ uVar14;
  uVar14 = uVar14 << 0x30 | uVar14 >> 0x10;
  uStack_f0 = uVar14 + uStack_f0;
  uVar15 = uStack_f0 ^ uVar15;
  uVar15 = uVar15 << 1 | (ulong)((long)uVar15 < 0);
  puVar20 = puVar20 + uVar26 + (long)local_b8[0xe];
  uVar16 = uVar16 ^ (ulong)puVar20;
  uVar13 = uVar16 << 0x20 | uVar16 >> 0x20;
  local_e8 = local_e8 + uVar13;
  uVar26 = uVar26 ^ local_e8;
  uVar16 = uVar26 << 0x28 | uVar26 >> 0x18;
  puVar20 = puVar20 + uVar16 + (long)local_b8[0xd];
  uVar13 = (ulong)puVar20 ^ uVar13;
  uVar13 = uVar13 << 0x30 | uVar13 >> 0x10;
  local_e8 = uVar13 + local_e8;
  uVar16 = local_e8 ^ uVar16;
  uVar16 = uVar16 << 1 | (ulong)((long)uVar16 < 0);
  puVar22 = puVar24 + uVar19 + (long)local_b8[4];
  uVar25 = uVar25 ^ (ulong)puVar22;
  uVar25 = uVar25 << 0x20 | uVar25 >> 0x20;
  uStack_e0 = uStack_e0 + uVar25;
  uVar19 = uVar19 ^ uStack_e0;
  uVar19 = uVar19 << 0x28 | uVar19 >> 0x18;
  puVar22 = puVar22 + uVar19 + (long)local_b8[10];
  uVar25 = (ulong)puVar22 ^ uVar25;
  uVar25 = uVar25 << 0x30 | uVar25 >> 0x10;
  uStack_e0 = uStack_e0 + uVar25;
  uVar19 = uStack_e0 ^ uVar19;
  uVar21 = uVar19 << 1 | (ulong)((long)uVar19 < 0);
  puVar23 = puVar23 + uVar15 + (long)local_b8[0];
  uVar25 = uVar25 ^ (ulong)puVar23;
  uVar25 = uVar25 << 0x20 | uVar25 >> 0x20;
  local_e8 = local_e8 + uVar25;
  uVar15 = uVar15 ^ local_e8;
  uVar15 = uVar15 << 0x28 | uVar15 >> 0x18;
  puVar23 = puVar23 + uVar15 + (long)local_b8[7];
  uVar25 = (ulong)puVar23 ^ uVar25;
  uVar26 = uVar25 << 0x30 | uVar25 >> 0x10;
  local_e8 = uVar26 + local_e8;
  uVar15 = local_e8 ^ uVar15;
  uVar19 = uVar15 << 1 | (ulong)((long)uVar15 < 0);
  puVar17 = puVar17 + uVar16 + (long)local_b8[6];
  uVar18 = uVar18 ^ (ulong)puVar17;
  uVar15 = uVar18 << 0x20 | uVar18 >> 0x20;
  uStack_e0 = uStack_e0 + uVar15;
  uVar16 = uVar16 ^ uStack_e0;
  uVar16 = uVar16 << 0x28 | uVar16 >> 0x18;
  puVar17 = puVar17 + uVar16 + (long)local_b8[3];
  uVar15 = (ulong)puVar17 ^ uVar15;
  uVar15 = uVar15 << 0x30 | uVar15 >> 0x10;
  uStack_e0 = uVar15 + uStack_e0;
  uVar16 = uStack_e0 ^ uVar16;
  uVar16 = uVar16 << 1 | (ulong)((long)uVar16 < 0);
  puVar20 = puVar20 + uVar21 + (long)local_b8[9];
  uVar14 = uVar14 ^ (ulong)puVar20;
  uVar14 = uVar14 << 0x20 | uVar14 >> 0x20;
  local_f8 = local_f8 + uVar14;
  uVar21 = uVar21 ^ local_f8;
  uVar25 = uVar21 << 0x28 | uVar21 >> 0x18;
  puVar20 = puVar20 + uVar25 + (long)local_b8[2];
  uVar14 = (ulong)puVar20 ^ uVar14;
  uVar14 = uVar14 << 0x30 | uVar14 >> 0x10;
  local_f8 = uVar14 + local_f8;
  uVar25 = local_f8 ^ uVar25;
  uVar25 = uVar25 << 1 | (ulong)((long)uVar25 < 0);
  puVar22 = puVar22 + uVar27 + (long)local_b8[8];
  uVar13 = uVar13 ^ (ulong)puVar22;
  uVar13 = uVar13 << 0x20 | uVar13 >> 0x20;
  uStack_f0 = uStack_f0 + uVar13;
  uVar27 = uVar27 ^ uStack_f0;
  uVar18 = uVar27 << 0x28 | uVar27 >> 0x18;
  puVar22 = puVar22 + uVar18 + (long)local_b8[0xb];
  uVar13 = (ulong)puVar22 ^ uVar13;
  uVar13 = uVar13 << 0x30 | uVar13 >> 0x10;
  uStack_f0 = uVar13 + uStack_f0;
  uVar18 = uStack_f0 ^ uVar18;
  uVar18 = uVar18 << 1 | (ulong)((long)uVar18 < 0);
  puVar23 = puVar23 + uVar18 + (long)local_b8[0xd];
  uVar15 = uVar15 ^ (ulong)puVar23;
  uVar21 = uVar15 << 0x20 | uVar15 >> 0x20;
  local_f8 = local_f8 + uVar21;
  uVar18 = uVar18 ^ local_f8;
  uVar15 = uVar18 << 0x28 | uVar18 >> 0x18;
  puVar23 = puVar23 + uVar15 + (long)local_b8[0xb];
  uVar21 = (ulong)puVar23 ^ uVar21;
  uVar27 = uVar21 << 0x30 | uVar21 >> 0x10;
  local_f8 = uVar27 + local_f8;
  uVar15 = local_f8 ^ uVar15;
  uVar21 = uVar15 << 1 | (ulong)((long)uVar15 < 0);
  puVar17 = puVar17 + uVar19 + (long)local_b8[7];
  uVar14 = uVar14 ^ (ulong)puVar17;
  uVar14 = uVar14 << 0x20 | uVar14 >> 0x20;
  uStack_f0 = uStack_f0 + uVar14;
  uVar19 = uVar19 ^ uStack_f0;
  uVar15 = uVar19 << 0x28 | uVar19 >> 0x18;
  puVar17 = puVar17 + uVar15 + (long)local_b8[0xe];
  uVar14 = (ulong)puVar17 ^ uVar14;
  uVar14 = uVar14 << 0x30 | uVar14 >> 0x10;
  uStack_f0 = uVar14 + uStack_f0;
  uVar15 = uStack_f0 ^ uVar15;
  uVar15 = uVar15 << 1 | (ulong)((long)uVar15 < 0);
  puVar20 = puVar20 + uVar16 + (long)local_b8[0xc];
  uVar13 = uVar13 ^ (ulong)puVar20;
  uVar13 = uVar13 << 0x20 | uVar13 >> 0x20;
  local_e8 = local_e8 + uVar13;
  uVar16 = uVar16 ^ local_e8;
  uVar16 = uVar16 << 0x28 | uVar16 >> 0x18;
  puVar20 = puVar20 + uVar16 + (long)local_b8[1];
  uVar13 = (ulong)puVar20 ^ uVar13;
  uVar13 = uVar13 << 0x30 | uVar13 >> 0x10;
  local_e8 = uVar13 + local_e8;
  uVar16 = local_e8 ^ uVar16;
  uVar16 = uVar16 << 1 | (ulong)((long)uVar16 < 0);
  puVar22 = puVar22 + uVar25 + (long)local_b8[3];
  uVar26 = uVar26 ^ (ulong)puVar22;
  uVar18 = uVar26 << 0x20 | uVar26 >> 0x20;
  uStack_e0 = uStack_e0 + uVar18;
  uVar25 = uVar25 ^ uStack_e0;
  uVar19 = uVar25 << 0x28 | uVar25 >> 0x18;
  puVar22 = puVar22 + uVar19 + (long)local_b8[9];
  uVar18 = (ulong)puVar22 ^ uVar18;
  uVar25 = uVar18 << 0x30 | uVar18 >> 0x10;
  uStack_e0 = uStack_e0 + uVar25;
  uVar19 = uStack_e0 ^ uVar19;
  uVar18 = uVar19 << 1 | (ulong)((long)uVar19 < 0);
  puVar23 = puVar23 + uVar15 + (long)local_b8[5];
  uVar25 = uVar25 ^ (ulong)puVar23;
  uVar25 = uVar25 << 0x20 | uVar25 >> 0x20;
  local_e8 = local_e8 + uVar25;
  uVar15 = uVar15 ^ local_e8;
  uVar15 = uVar15 << 0x28 | uVar15 >> 0x18;
  puVar23 = puVar23 + uVar15 + (long)local_b8[0];
  uVar25 = (ulong)puVar23 ^ uVar25;
  uVar26 = uVar25 << 0x30 | uVar25 >> 0x10;
  local_e8 = uVar26 + local_e8;
  uVar15 = local_e8 ^ uVar15;
  uVar19 = uVar15 << 1 | (ulong)((long)uVar15 < 0);
  puVar17 = puVar17 + uVar16 + (long)local_b8[0xf];
  uVar27 = uVar27 ^ (ulong)puVar17;
  uVar15 = uVar27 << 0x20 | uVar27 >> 0x20;
  uStack_e0 = uStack_e0 + uVar15;
  uVar16 = uVar16 ^ uStack_e0;
  uVar16 = uVar16 << 0x28 | uVar16 >> 0x18;
  puVar17 = puVar17 + uVar16 + (long)local_b8[4];
  uVar15 = (ulong)puVar17 ^ uVar15;
  uVar15 = uVar15 << 0x30 | uVar15 >> 0x10;
  uStack_e0 = uVar15 + uStack_e0;
  uVar16 = uStack_e0 ^ uVar16;
  uVar16 = uVar16 << 1 | (ulong)((long)uVar16 < 0);
  puVar20 = puVar20 + uVar18 + (long)local_b8[8];
  uVar14 = uVar14 ^ (ulong)puVar20;
  uVar14 = uVar14 << 0x20 | uVar14 >> 0x20;
  local_f8 = local_f8 + uVar14;
  uVar18 = uVar18 ^ local_f8;
  uVar25 = uVar18 << 0x28 | uVar18 >> 0x18;
  puVar20 = puVar20 + uVar25 + (long)local_b8[6];
  uVar14 = (ulong)puVar20 ^ uVar14;
  uVar14 = uVar14 << 0x30 | uVar14 >> 0x10;
  local_f8 = uVar14 + local_f8;
  uVar25 = local_f8 ^ uVar25;
  uVar25 = uVar25 << 1 | (ulong)((long)uVar25 < 0);
  puVar22 = puVar22 + uVar21 + (long)local_b8[2];
  uVar13 = uVar13 ^ (ulong)puVar22;
  uVar13 = uVar13 << 0x20 | uVar13 >> 0x20;
  uStack_f0 = uStack_f0 + uVar13;
  uVar21 = uVar21 ^ uStack_f0;
  uVar18 = uVar21 << 0x28 | uVar21 >> 0x18;
  puVar22 = puVar22 + uVar18 + (long)local_b8[10];
  uVar13 = (ulong)puVar22 ^ uVar13;
  uVar13 = uVar13 << 0x30 | uVar13 >> 0x10;
  uStack_f0 = uVar13 + uStack_f0;
  uVar18 = uStack_f0 ^ uVar18;
  uVar18 = uVar18 << 1 | (ulong)((long)uVar18 < 0);
  puVar23 = puVar23 + uVar18 + (long)local_b8[6];
  uVar15 = uVar15 ^ (ulong)puVar23;
  uVar21 = uVar15 << 0x20 | uVar15 >> 0x20;
  local_f8 = local_f8 + uVar21;
  uVar18 = uVar18 ^ local_f8;
  uVar15 = uVar18 << 0x28 | uVar18 >> 0x18;
  puVar23 = puVar23 + uVar15 + (long)local_b8[0xf];
  uVar21 = (ulong)puVar23 ^ uVar21;
  uVar27 = uVar21 << 0x30 | uVar21 >> 0x10;
  local_f8 = uVar27 + local_f8;
  uVar15 = local_f8 ^ uVar15;
  uVar21 = uVar15 << 1 | (ulong)((long)uVar15 < 0);
  puVar17 = puVar17 + uVar19 + (long)local_b8[0xe];
  uVar14 = uVar14 ^ (ulong)puVar17;
  uVar14 = uVar14 << 0x20 | uVar14 >> 0x20;
  uStack_f0 = uStack_f0 + uVar14;
  uVar19 = uVar19 ^ uStack_f0;
  uVar15 = uVar19 << 0x28 | uVar19 >> 0x18;
  puVar17 = puVar17 + uVar15 + (long)local_b8[9];
  uVar14 = (ulong)puVar17 ^ uVar14;
  uVar14 = uVar14 << 0x30 | uVar14 >> 0x10;
  uStack_f0 = uVar14 + uStack_f0;
  uVar15 = uStack_f0 ^ uVar15;
  uVar15 = uVar15 << 1 | (ulong)((long)uVar15 < 0);
  puVar20 = puVar20 + uVar16 + (long)local_b8[0xb];
  uVar13 = uVar13 ^ (ulong)puVar20;
  uVar13 = uVar13 << 0x20 | uVar13 >> 0x20;
  local_e8 = local_e8 + uVar13;
  uVar16 = uVar16 ^ local_e8;
  uVar16 = uVar16 << 0x28 | uVar16 >> 0x18;
  puVar20 = puVar20 + uVar16 + (long)local_b8[3];
  uVar13 = (ulong)puVar20 ^ uVar13;
  uVar13 = uVar13 << 0x30 | uVar13 >> 0x10;
  local_e8 = uVar13 + local_e8;
  uVar16 = local_e8 ^ uVar16;
  uVar16 = uVar16 << 1 | (ulong)((long)uVar16 < 0);
  puVar22 = puVar22 + uVar25 + (long)local_b8[0];
  uVar26 = uVar26 ^ (ulong)puVar22;
  uVar18 = uVar26 << 0x20 | uVar26 >> 0x20;
  uStack_e0 = uStack_e0 + uVar18;
  uVar25 = uVar25 ^ uStack_e0;
  uVar19 = uVar25 << 0x28 | uVar25 >> 0x18;
  puVar22 = puVar22 + uVar19 + (long)local_b8[8];
  uVar18 = (ulong)puVar22 ^ uVar18;
  uVar25 = uVar18 << 0x30 | uVar18 >> 0x10;
  uStack_e0 = uStack_e0 + uVar25;
  uVar19 = uStack_e0 ^ uVar19;
  uVar18 = uVar19 << 1 | (ulong)((long)uVar19 < 0);
  puVar23 = puVar23 + uVar15 + (long)local_b8[0xc];
  uVar25 = uVar25 ^ (ulong)puVar23;
  uVar25 = uVar25 << 0x20 | uVar25 >> 0x20;
  local_e8 = local_e8 + uVar25;
  uVar15 = uVar15 ^ local_e8;
  uVar15 = uVar15 << 0x28 | uVar15 >> 0x18;
  puVar23 = puVar23 + uVar15 + (long)local_b8[2];
  uVar25 = (ulong)puVar23 ^ uVar25;
  uVar26 = uVar25 << 0x30 | uVar25 >> 0x10;
  local_e8 = uVar26 + local_e8;
  uVar15 = local_e8 ^ uVar15;
  uVar19 = uVar15 << 1 | (ulong)((long)uVar15 < 0);
  puVar17 = puVar17 + uVar16 + (long)local_b8[0xd];
  uVar27 = uVar27 ^ (ulong)puVar17;
  uVar15 = uVar27 << 0x20 | uVar27 >> 0x20;
  uStack_e0 = uStack_e0 + uVar15;
  uVar16 = uVar16 ^ uStack_e0;
  uVar16 = uVar16 << 0x28 | uVar16 >> 0x18;
  puVar17 = puVar17 + uVar16 + (long)local_b8[7];
  uVar15 = (ulong)puVar17 ^ uVar15;
  uVar15 = uVar15 << 0x30 | uVar15 >> 0x10;
  uStack_e0 = uVar15 + uStack_e0;
  uVar16 = uStack_e0 ^ uVar16;
  uVar16 = uVar16 << 1 | (ulong)((long)uVar16 < 0);
  puVar20 = puVar20 + uVar18 + (long)local_b8[1];
  uVar14 = uVar14 ^ (ulong)puVar20;
  uVar14 = uVar14 << 0x20 | uVar14 >> 0x20;
  local_f8 = local_f8 + uVar14;
  uVar18 = uVar18 ^ local_f8;
  uVar25 = uVar18 << 0x28 | uVar18 >> 0x18;
  puVar20 = puVar20 + uVar25 + (long)local_b8[4];
  uVar14 = (ulong)puVar20 ^ uVar14;
  uVar14 = uVar14 << 0x30 | uVar14 >> 0x10;
  local_f8 = uVar14 + local_f8;
  uVar25 = local_f8 ^ uVar25;
  uVar25 = uVar25 << 1 | (ulong)((long)uVar25 < 0);
  puVar22 = puVar22 + uVar21 + (long)local_b8[10];
  uVar13 = uVar13 ^ (ulong)puVar22;
  uVar13 = uVar13 << 0x20 | uVar13 >> 0x20;
  uStack_f0 = uStack_f0 + uVar13;
  uVar21 = uVar21 ^ uStack_f0;
  uVar18 = uVar21 << 0x28 | uVar21 >> 0x18;
  puVar22 = puVar22 + uVar18 + (long)local_b8[5];
  uVar13 = (ulong)puVar22 ^ uVar13;
  uVar13 = uVar13 << 0x30 | uVar13 >> 0x10;
  uStack_f0 = uVar13 + uStack_f0;
  uVar18 = uStack_f0 ^ uVar18;
  uVar18 = uVar18 << 1 | (ulong)((long)uVar18 < 0);
  puVar23 = puVar23 + uVar18 + (long)local_b8[10];
  uVar15 = uVar15 ^ (ulong)puVar23;
  uVar21 = uVar15 << 0x20 | uVar15 >> 0x20;
  local_f8 = local_f8 + uVar21;
  uVar18 = uVar18 ^ local_f8;
  uVar15 = uVar18 << 0x28 | uVar18 >> 0x18;
  puVar23 = puVar23 + uVar15 + (long)local_b8[2];
  uVar21 = (ulong)puVar23 ^ uVar21;
  uVar27 = uVar21 << 0x30 | uVar21 >> 0x10;
  local_f8 = uVar27 + local_f8;
  uVar15 = local_f8 ^ uVar15;
  uVar21 = uVar15 << 1 | (ulong)((long)uVar15 < 0);
  puVar17 = puVar17 + uVar19 + (long)local_b8[8];
  uVar14 = uVar14 ^ (ulong)puVar17;
  uVar14 = uVar14 << 0x20 | uVar14 >> 0x20;
  uStack_f0 = uStack_f0 + uVar14;
  uVar19 = uVar19 ^ uStack_f0;
  uVar15 = uVar19 << 0x28 | uVar19 >> 0x18;
  puVar17 = puVar17 + uVar15 + (long)local_b8[4];
  uVar14 = (ulong)puVar17 ^ uVar14;
  uVar14 = uVar14 << 0x30 | uVar14 >> 0x10;
  uStack_f0 = uVar14 + uStack_f0;
  uVar15 = uStack_f0 ^ uVar15;
  uVar15 = uVar15 << 1 | (ulong)((long)uVar15 < 0);
  puVar20 = puVar20 + uVar16 + (long)local_b8[7];
  uVar13 = uVar13 ^ (ulong)puVar20;
  uVar13 = uVar13 << 0x20 | uVar13 >> 0x20;
  local_e8 = local_e8 + uVar13;
  uVar16 = uVar16 ^ local_e8;
  uVar16 = uVar16 << 0x28 | uVar16 >> 0x18;
  puVar20 = puVar20 + uVar16 + (long)local_b8[6];
  uVar13 = (ulong)puVar20 ^ uVar13;
  uVar13 = uVar13 << 0x30 | uVar13 >> 0x10;
  local_e8 = uVar13 + local_e8;
  uVar16 = local_e8 ^ uVar16;
  uVar16 = uVar16 << 1 | (ulong)((long)uVar16 < 0);
  puVar22 = puVar22 + uVar25 + (long)local_b8[1];
  uVar26 = uVar26 ^ (ulong)puVar22;
  uVar18 = uVar26 << 0x20 | uVar26 >> 0x20;
  uStack_e0 = uStack_e0 + uVar18;
  uVar25 = uVar25 ^ uStack_e0;
  uVar19 = uVar25 << 0x28 | uVar25 >> 0x18;
  puVar22 = puVar22 + uVar19 + (long)local_b8[5];
  uVar18 = (ulong)puVar22 ^ uVar18;
  uVar25 = uVar18 << 0x30 | uVar18 >> 0x10;
  uStack_e0 = uStack_e0 + uVar25;
  uVar19 = uStack_e0 ^ uVar19;
  uVar18 = uVar19 << 1 | (ulong)((long)uVar19 < 0);
  puVar23 = puVar23 + uVar15 + (long)local_b8[0xf];
  uVar25 = uVar25 ^ (ulong)puVar23;
  uVar25 = uVar25 << 0x20 | uVar25 >> 0x20;
  local_e8 = local_e8 + uVar25;
  uVar15 = uVar15 ^ local_e8;
  uVar15 = uVar15 << 0x28 | uVar15 >> 0x18;
  puVar23 = puVar23 + uVar15 + (long)local_b8[0xb];
  uVar25 = (ulong)puVar23 ^ uVar25;
  uVar26 = uVar25 << 0x30 | uVar25 >> 0x10;
  local_e8 = uVar26 + local_e8;
  uVar15 = local_e8 ^ uVar15;
  uVar19 = uVar15 << 1 | (ulong)((long)uVar15 < 0);
  puVar17 = puVar17 + uVar16 + (long)local_b8[9];
  uVar27 = uVar27 ^ (ulong)puVar17;
  uVar15 = uVar27 << 0x20 | uVar27 >> 0x20;
  uStack_e0 = uStack_e0 + uVar15;
  uVar16 = uVar16 ^ uStack_e0;
  uVar16 = uVar16 << 0x28 | uVar16 >> 0x18;
  puVar17 = puVar17 + uVar16 + (long)local_b8[0xe];
  uVar15 = (ulong)puVar17 ^ uVar15;
  uVar15 = uVar15 << 0x30 | uVar15 >> 0x10;
  uStack_e0 = uVar15 + uStack_e0;
  uVar16 = uStack_e0 ^ uVar16;
  uVar16 = uVar16 << 1 | (ulong)((long)uVar16 < 0);
  puVar20 = puVar20 + uVar18 + (long)local_b8[3];
  uVar14 = uVar14 ^ (ulong)puVar20;
  uVar14 = uVar14 << 0x20 | uVar14 >> 0x20;
  local_f8 = local_f8 + uVar14;
  uVar18 = uVar18 ^ local_f8;
  uVar25 = uVar18 << 0x28 | uVar18 >> 0x18;
  puVar20 = puVar20 + uVar25 + (long)local_b8[0xc];
  uVar14 = (ulong)puVar20 ^ uVar14;
  uVar14 = uVar14 << 0x30 | uVar14 >> 0x10;
  local_f8 = uVar14 + local_f8;
  uVar25 = local_f8 ^ uVar25;
  uVar25 = uVar25 << 1 | (ulong)((long)uVar25 < 0);
  puVar22 = puVar22 + uVar21 + (long)local_b8[0xd];
  uVar13 = uVar13 ^ (ulong)puVar22;
  uVar13 = uVar13 << 0x20 | uVar13 >> 0x20;
  uStack_f0 = uStack_f0 + uVar13;
  uVar21 = uVar21 ^ uStack_f0;
  uVar18 = uVar21 << 0x28 | uVar21 >> 0x18;
  puVar22 = puVar22 + uVar18 + (long)local_b8[0];
  uVar13 = (ulong)puVar22 ^ uVar13;
  uVar13 = uVar13 << 0x30 | uVar13 >> 0x10;
  uStack_f0 = uVar13 + uStack_f0;
  uVar18 = uStack_f0 ^ uVar18;
  uVar18 = uVar18 << 1 | (ulong)((long)uVar18 < 0);
  puVar23 = puVar23 + uVar18 + (long)local_b8[0];
  uVar15 = uVar15 ^ (ulong)puVar23;
  uVar21 = uVar15 << 0x20 | uVar15 >> 0x20;
  local_f8 = local_f8 + uVar21;
  uVar18 = uVar18 ^ local_f8;
  uVar15 = uVar18 << 0x28 | uVar18 >> 0x18;
  puVar23 = puVar23 + uVar15 + (long)local_b8[1];
  uVar21 = (ulong)puVar23 ^ uVar21;
  uVar27 = uVar21 << 0x30 | uVar21 >> 0x10;
  local_f8 = uVar27 + local_f8;
  uVar15 = local_f8 ^ uVar15;
  uVar21 = uVar15 << 1 | (ulong)((long)uVar15 < 0);
  puVar17 = puVar17 + uVar19 + (long)local_b8[2];
  uVar14 = uVar14 ^ (ulong)puVar17;
  uVar14 = uVar14 << 0x20 | uVar14 >> 0x20;
  uStack_f0 = uStack_f0 + uVar14;
  uVar19 = uVar19 ^ uStack_f0;
  uVar15 = uVar19 << 0x28 | uVar19 >> 0x18;
  puVar17 = puVar17 + uVar15 + (long)local_b8[3];
  uVar14 = (ulong)puVar17 ^ uVar14;
  uVar14 = uVar14 << 0x30 | uVar14 >> 0x10;
  uStack_f0 = uVar14 + uStack_f0;
  uVar15 = uStack_f0 ^ uVar15;
  uVar15 = uVar15 << 1 | (ulong)((long)uVar15 < 0);
  puVar20 = puVar20 + uVar16 + (long)local_b8[4];
  uVar13 = uVar13 ^ (ulong)puVar20;
  uVar13 = uVar13 << 0x20 | uVar13 >> 0x20;
  local_e8 = local_e8 + uVar13;
  uVar16 = uVar16 ^ local_e8;
  uVar16 = uVar16 << 0x28 | uVar16 >> 0x18;
  puVar20 = puVar20 + uVar16 + (long)local_b8[5];
  uVar13 = (ulong)puVar20 ^ uVar13;
  uVar13 = uVar13 << 0x30 | uVar13 >> 0x10;
  local_e8 = uVar13 + local_e8;
  uVar16 = local_e8 ^ uVar16;
  uVar16 = uVar16 << 1 | (ulong)((long)uVar16 < 0);
  puVar22 = puVar22 + uVar25 + (long)local_b8[6];
  uVar26 = uVar26 ^ (ulong)puVar22;
  uVar18 = uVar26 << 0x20 | uVar26 >> 0x20;
  uStack_e0 = uStack_e0 + uVar18;
  uVar25 = uVar25 ^ uStack_e0;
  uVar19 = uVar25 << 0x28 | uVar25 >> 0x18;
  puVar22 = puVar22 + uVar19 + (long)local_b8[7];
  uVar18 = (ulong)puVar22 ^ uVar18;
  uVar25 = uVar18 << 0x30 | uVar18 >> 0x10;
  uStack_e0 = uStack_e0 + uVar25;
  uVar19 = uStack_e0 ^ uVar19;
  uVar18 = uVar19 << 1 | (ulong)((long)uVar19 < 0);
  puVar23 = puVar23 + uVar15 + (long)local_b8[8];
  uVar25 = uVar25 ^ (ulong)puVar23;
  uVar25 = uVar25 << 0x20 | uVar25 >> 0x20;
  local_e8 = local_e8 + uVar25;
  uVar15 = uVar15 ^ local_e8;
  uVar15 = uVar15 << 0x28 | uVar15 >> 0x18;
  puVar23 = puVar23 + uVar15 + (long)local_b8[9];
  uVar25 = (ulong)puVar23 ^ uVar25;
  uVar26 = uVar25 << 0x30 | uVar25 >> 0x10;
  local_e8 = uVar26 + local_e8;
  uVar15 = local_e8 ^ uVar15;
  uVar19 = uVar15 << 1 | (ulong)((long)uVar15 < 0);
  puVar17 = puVar17 + uVar16 + (long)local_b8[10];
  uVar27 = uVar27 ^ (ulong)puVar17;
  uVar15 = uVar27 << 0x20 | uVar27 >> 0x20;
  uStack_e0 = uStack_e0 + uVar15;
  uVar16 = uVar16 ^ uStack_e0;
  uVar16 = uVar16 << 0x28 | uVar16 >> 0x18;
  puVar17 = puVar17 + uVar16 + (long)local_b8[0xb];
  uVar15 = (ulong)puVar17 ^ uVar15;
  uVar15 = uVar15 << 0x30 | uVar15 >> 0x10;
  uStack_e0 = uVar15 + uStack_e0;
  uVar16 = uStack_e0 ^ uVar16;
  uVar16 = uVar16 << 1 | (ulong)((long)uVar16 < 0);
  puVar20 = puVar20 + uVar18 + (long)local_b8[0xc];
  uVar14 = uVar14 ^ (ulong)puVar20;
  uVar14 = uVar14 << 0x20 | uVar14 >> 0x20;
  local_f8 = local_f8 + uVar14;
  uVar18 = uVar18 ^ local_f8;
  uVar25 = uVar18 << 0x28 | uVar18 >> 0x18;
  puVar20 = puVar20 + uVar25 + (long)local_b8[0xd];
  uVar14 = (ulong)puVar20 ^ uVar14;
  uVar14 = uVar14 << 0x30 | uVar14 >> 0x10;
  local_f8 = uVar14 + local_f8;
  uVar25 = local_f8 ^ uVar25;
  uVar25 = uVar25 << 1 | (ulong)((long)uVar25 < 0);
  puVar22 = puVar22 + uVar21 + (long)local_b8[0xe];
  uVar13 = uVar13 ^ (ulong)puVar22;
  uVar13 = uVar13 << 0x20 | uVar13 >> 0x20;
  uStack_f0 = uStack_f0 + uVar13;
  uVar21 = uVar21 ^ uStack_f0;
  uVar18 = uVar21 << 0x28 | uVar21 >> 0x18;
  puVar22 = puVar22 + uVar18 + (long)local_b8[0xf];
  uVar13 = (ulong)puVar22 ^ uVar13;
  uVar13 = uVar13 << 0x30 | uVar13 >> 0x10;
  uStack_f0 = uVar13 + uStack_f0;
  uVar18 = uStack_f0 ^ uVar18;
  uVar18 = uVar18 << 1 | (ulong)((long)uVar18 < 0);
  puVar23 = puVar23 + uVar18 + (long)local_b8[0xe];
  uVar15 = uVar15 ^ (ulong)puVar23;
  uVar21 = uVar15 << 0x20 | uVar15 >> 0x20;
  local_f8 = local_f8 + uVar21;
  uVar18 = uVar18 ^ local_f8;
  uVar15 = uVar18 << 0x28 | uVar18 >> 0x18;
  puVar23 = puVar23 + uVar15 + (long)local_b8[10];
  uVar21 = (ulong)puVar23 ^ uVar21;
  uVar27 = uVar21 << 0x30 | uVar21 >> 0x10;
  local_f8 = uVar27 + local_f8;
  uVar15 = local_f8 ^ uVar15;
  uVar21 = uVar15 << 1 | (ulong)((long)uVar15 < 0);
  puVar17 = puVar17 + uVar19 + (long)local_b8[4];
  uVar14 = uVar14 ^ (ulong)puVar17;
  uVar14 = uVar14 << 0x20 | uVar14 >> 0x20;
  uStack_f0 = uStack_f0 + uVar14;
  uVar19 = uVar19 ^ uStack_f0;
  uVar15 = uVar19 << 0x28 | uVar19 >> 0x18;
  puVar17 = puVar17 + uVar15 + (long)local_b8[8];
  uVar14 = (ulong)puVar17 ^ uVar14;
  uVar14 = uVar14 << 0x30 | uVar14 >> 0x10;
  uStack_f0 = uVar14 + uStack_f0;
  uVar15 = uStack_f0 ^ uVar15;
  uVar15 = uVar15 << 1 | (ulong)((long)uVar15 < 0);
  puVar20 = puVar20 + uVar16 + (long)local_b8[9];
  uVar13 = uVar13 ^ (ulong)puVar20;
  uVar13 = uVar13 << 0x20 | uVar13 >> 0x20;
  local_e8 = local_e8 + uVar13;
  uVar16 = uVar16 ^ local_e8;
  uVar16 = uVar16 << 0x28 | uVar16 >> 0x18;
  puVar20 = puVar20 + uVar16 + (long)local_b8[0xf];
  uVar13 = (ulong)puVar20 ^ uVar13;
  uVar13 = uVar13 << 0x30 | uVar13 >> 0x10;
  local_e8 = uVar13 + local_e8;
  uVar16 = local_e8 ^ uVar16;
  uVar16 = uVar16 << 1 | (ulong)((long)uVar16 < 0);
  puVar22 = puVar22 + uVar25 + (long)local_b8[0xd];
  uVar26 = uVar26 ^ (ulong)puVar22;
  uVar18 = uVar26 << 0x20 | uVar26 >> 0x20;
  uStack_e0 = uStack_e0 + uVar18;
  uVar25 = uVar25 ^ uStack_e0;
  uVar19 = uVar25 << 0x28 | uVar25 >> 0x18;
  puVar22 = puVar22 + uVar19 + (long)local_b8[6];
  uVar18 = (ulong)puVar22 ^ uVar18;
  uVar25 = uVar18 << 0x30 | uVar18 >> 0x10;
  uStack_e0 = uStack_e0 + uVar25;
  uVar19 = uStack_e0 ^ uVar19;
  uVar18 = uVar19 << 1 | (ulong)((long)uVar19 < 0);
  puVar23 = puVar23 + uVar15 + (long)local_b8[1];
  uVar25 = uVar25 ^ (ulong)puVar23;
  uVar25 = uVar25 << 0x20 | uVar25 >> 0x20;
  local_e8 = local_e8 + uVar25;
  uVar15 = uVar15 ^ local_e8;
  uVar15 = uVar15 << 0x28 | uVar15 >> 0x18;
  local_138 = puVar23 + uVar15 + (long)local_b8[0xc];
  uVar25 = (ulong)local_138 ^ uVar25;
  uStack_c0 = uVar25 << 0x30 | uVar25 >> 0x10;
  local_e8 = uStack_c0 + local_e8;
  uVar15 = local_e8 ^ uVar15;
  uStack_110 = uVar15 << 1 | (ulong)((long)uVar15 < 0);
  puVar17 = puVar17 + uVar16 + (long)local_b8[0];
  uVar27 = uVar27 ^ (ulong)puVar17;
  uVar15 = uVar27 << 0x20 | uVar27 >> 0x20;
  uStack_e0 = uStack_e0 + uVar15;
  uVar16 = uVar16 ^ uStack_e0;
  uVar16 = uVar16 << 0x28 | uVar16 >> 0x18;
  uStack_130 = puVar17 + uVar16 + (long)local_b8[2];
  uVar15 = (ulong)uStack_130 ^ uVar15;
  local_d8 = uVar15 << 0x30 | uVar15 >> 0x10;
  uStack_e0 = local_d8 + uStack_e0;
  uVar16 = uStack_e0 ^ uVar16;
  local_108 = uVar16 << 1 | (ulong)((long)uVar16 < 0);
  puVar17 = puVar20 + uVar18 + (long)local_b8[0xb];
  uVar14 = uVar14 ^ (ulong)puVar17;
  uVar14 = uVar14 << 0x20 | uVar14 >> 0x20;
  local_f8 = local_f8 + uVar14;
  uVar18 = uVar18 ^ local_f8;
  uVar15 = uVar18 << 0x28 | uVar18 >> 0x18;
  local_128 = puVar17 + uVar15 + (long)local_b8[7];
  uVar14 = (ulong)local_128 ^ uVar14;
  uStack_d0 = uVar14 << 0x30 | uVar14 >> 0x10;
  local_f8 = uStack_d0 + local_f8;
  uVar15 = local_f8 ^ uVar15;
  uStack_100 = uVar15 << 1 | (ulong)((long)uVar15 < 0);
  puVar17 = puVar22 + uVar21 + (long)local_b8[5];
  uVar13 = uVar13 ^ (ulong)puVar17;
  uVar14 = uVar13 << 0x20 | uVar13 >> 0x20;
  uStack_f0 = uStack_f0 + uVar14;
  uVar21 = uVar21 ^ uStack_f0;
  uVar15 = uVar21 << 0x28 | uVar21 >> 0x18;
  puStack_120 = puVar17 + uVar15 + (long)local_b8[3];
  uVar14 = (ulong)puStack_120 ^ uVar14;
  local_c8 = uVar14 << 0x30 | uVar14 >> 0x10;
  uStack_f0 = local_c8 + uStack_f0;
  uVar15 = uStack_f0 ^ uVar15;
  local_118 = uVar15 << 1 | (ulong)((long)uVar15 < 0);
  lVar12 = 0;
  do {
    puVar1 = S->h + lVar12;
    uVar3 = *(uint *)((long)puVar1 + 4);
    uVar11 = puVar1[1];
    uVar4 = *(uint *)((long)puVar1 + 0xc);
    uVar5 = *(uint *)((long)&local_138 + lVar12 * 8 + 4);
    uVar6 = *(uint *)(&uStack_130 + lVar12);
    uVar7 = *(uint *)((long)&uStack_130 + lVar12 * 8 + 4);
    uVar8 = *(uint *)((long)&local_f8 + lVar12 * 8 + 4);
    uVar9 = *(uint *)(&uStack_f0 + lVar12);
    uVar10 = *(uint *)((long)&uStack_f0 + lVar12 * 8 + 4);
    puVar2 = S->h + lVar12;
    *(uint *)puVar2 = (uint)*puVar1 ^ *(uint *)(&local_138 + lVar12) ^ *(uint *)(&local_f8 + lVar12)
    ;
    *(uint *)((long)puVar2 + 4) = uVar3 ^ uVar5 ^ uVar8;
    *(uint *)(puVar2 + 1) = (uint)uVar11 ^ uVar6 ^ uVar9;
    *(uint *)((long)puVar2 + 0xc) = uVar4 ^ uVar7 ^ uVar10;
    lVar12 = lVar12 + 2;
  } while (lVar12 != 8);
  if (*(long *)(in_FS_OFFSET + 0x28) == local_38) {
    return;
  }
  __stack_chk_fail();
}

Assistant:

static void blake2b_compress( blake2b_state *S, const uint8_t block[BLAKE2B_BLOCKBYTES] )
{
  uint64_t m[16];
  uint64_t v[16];
  size_t i;

  for( i = 0; i < 16; ++i ) {
    m[i] = load64( block + i * sizeof( m[i] ) );
  }

  for( i = 0; i < 8; ++i ) {
    v[i] = S->h[i];
  }

  v[ 8] = blake2b_IV[0];
  v[ 9] = blake2b_IV[1];
  v[10] = blake2b_IV[2];
  v[11] = blake2b_IV[3];
  v[12] = blake2b_IV[4] ^ S->t[0];
  v[13] = blake2b_IV[5] ^ S->t[1];
  v[14] = blake2b_IV[6] ^ S->f[0];
  v[15] = blake2b_IV[7] ^ S->f[1];

  ROUND( 0 );
  ROUND( 1 );
  ROUND( 2 );
  ROUND( 3 );
  ROUND( 4 );
  ROUND( 5 );
  ROUND( 6 );
  ROUND( 7 );
  ROUND( 8 );
  ROUND( 9 );
  ROUND( 10 );
  ROUND( 11 );

  for( i = 0; i < 8; ++i ) {
    S->h[i] = S->h[i] ^ v[i] ^ v[i + 8];
  }
}